

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_addwc_mips(target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict *env)

{
  uint32_t uVar1;
  long lVar2;
  int64_t tempL;
  int32_t temp31;
  int32_t temp32;
  uint32_t rd;
  CPUMIPSState_conflict *env_local;
  target_ulong_conflict rt_local;
  target_ulong_conflict rs_local;
  
  uVar1 = get_DSPControl_carryflag(env);
  lVar2 = (long)(int)rs + (long)(int)rt + (ulong)uVar1;
  if (((uint)(lVar2 >> 0x1f) & 1) != ((uint)((ulong)lVar2 >> 0x20) & 1)) {
    set_DSPControl_overflow_flag(1,0x14,env);
  }
  return (target_ulong_conflict)lVar2;
}

Assistant:

target_ulong helper_addwc(target_ulong rs, target_ulong rt, CPUMIPSState *env)
{
    uint32_t rd;
    int32_t temp32, temp31;
    int64_t tempL;

    tempL = (int64_t)(int32_t)rs + (int64_t)(int32_t)rt +
        get_DSPControl_carryflag(env);
    temp31 = (tempL >> 31) & 0x01;
    temp32 = (tempL >> 32) & 0x01;

    if (temp31 != temp32) {
        set_DSPControl_overflow_flag(1, 20, env);
    }

    rd = tempL & MIPSDSP_LLO;

    return (target_long)(int32_t)rd;
}